

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParsePcharW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                        UriMemoryManager *memory)

{
  wchar_t *pwVar1;
  
  if (first < afterLast) {
    switch(*first) {
    case L'!':
    case L'$':
    case L'&':
    case L'\'':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L',':
    case L'-':
    case L'.':
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
    case L':':
    case L';':
    case L'=':
    case L'@':
    case L'A':
    case L'B':
    case L'C':
    case L'D':
    case L'E':
    case L'F':
    case L'G':
    case L'H':
    case L'I':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'N':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'S':
    case L'T':
    case L'U':
    case L'V':
    case L'W':
    case L'X':
    case L'Y':
    case L'Z':
    case L'_':
    case L'a':
    case L'b':
    case L'c':
    case L'd':
    case L'e':
    case L'f':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'n':
    case L'o':
    case L'p':
    case L'q':
    case L'r':
    case L's':
    case L't':
    case L'u':
    case L'v':
    case L'w':
    case L'x':
    case L'y':
    case L'z':
    case L'~':
      return first + 1;
    default:
      uriFreeUriMembersMmW(state->uri,memory);
      state->errorPos = first;
      break;
    case L'%':
      pwVar1 = uriParsePctEncodedW(state,first,afterLast,memory);
      return pwVar1;
    }
  }
  else {
    uriFreeUriMembersMmW(state->uri,memory);
    state->errorPos = afterLast;
  }
  state->errorCode = L'\x01';
  return (wchar_t *)0x0;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePchar)(URI_TYPE(ParserState) * state,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriMemoryManager * memory) {
	if (first >= afterLast) {
		URI_FUNC(StopSyntax)(state, afterLast, memory);
		return NULL;
	}

	switch (*first) {
	case _UT('%'):
		return URI_FUNC(ParsePctEncoded)(state, first, afterLast, memory);

	case _UT(':'):
	case _UT('@'):
	case _UT('!'):
	case _UT('$'):
	case _UT('&'):
	case _UT('('):
	case _UT(')'):
	case _UT('*'):
	case _UT(','):
	case _UT(';'):
	case _UT('\''):
	case _UT('+'):
	case _UT('='):
	case _UT('-'):
	case _UT('.'):
	case _UT('_'):
	case _UT('~'):
	case URI_SET_DIGIT:
	case URI_SET_ALPHA:
		return first + 1;

	default:
		URI_FUNC(StopSyntax)(state, first, memory);
		return NULL;
	}
}